

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageManager.cpp
# Opt level: O2

Message * __thiscall
ki::protocol::dml::MessageManager::create_message
          (MessageManager *this,uint8_t service_id,uint8_t message_type)

{
  MessageModule *this_00;
  Message *pMVar1;
  ostream *this_01;
  value_error *this_02;
  string local_1b0;
  ostringstream oss;
  
  this_00 = get_module(this,service_id);
  if (this_00 != (MessageModule *)0x0) {
    pMVar1 = MessageModule::create_message(this_00,message_type);
    return pMVar1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  this_01 = std::operator<<((ostream *)&oss,"No service exists with id: ");
  std::ostream::operator<<(this_01,(ushort)service_id);
  this_02 = (value_error *)__cxa_allocate_exception(0x18);
  std::__cxx11::stringbuf::str();
  value_error::value_error(this_02,&local_1b0,DML_INVALID_SERVICE);
  __cxa_throw(this_02,&value_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Message *MessageManager::create_message(uint8_t service_id, uint8_t message_type) const
	{
		auto *message_module = get_module(service_id);
		if (!message_module)
		{
			std::ostringstream oss;
			oss << "No service exists with id: " << (uint16_t)service_id;
			throw value_error(oss.str(), value_error::DML_INVALID_SERVICE);
		}

		return message_module->create_message(message_type);
	}